

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

unqlite_col * unqliteVmFetchCollection(unqlite_vm *pVm,SyString *pName)

{
  sxu32 sVar1;
  int local_30;
  unqlite_col *puStack_28;
  sxu32 nHash;
  unqlite_col *pCol;
  SyString *pName_local;
  unqlite_vm *pVm_local;
  
  if (pVm->iCol != 0) {
    sVar1 = SyBinHash(pName->zString,pName->nByte);
    for (puStack_28 = pVm->apCol[sVar1 & pVm->iColSize - 1]; puStack_28 != (unqlite_col *)0x0;
        puStack_28 = puStack_28->pNextCol) {
      if (sVar1 == puStack_28->nHash) {
        if (pName->nByte == (puStack_28->sName).nByte) {
          local_30 = SyMemcmp(pName->zString,(puStack_28->sName).zString,(puStack_28->sName).nByte);
        }
        else {
          local_30 = pName->nByte - (puStack_28->sName).nByte;
        }
        if (local_30 == 0) {
          return puStack_28;
        }
      }
    }
  }
  return (unqlite_col *)0x0;
}

Assistant:

static unqlite_col * unqliteVmFetchCollection(
	unqlite_vm *pVm, /* Target VM */
	SyString *pName  /* Lookup name */
	)
{
	unqlite_col *pCol;
	sxu32 nHash;
	if( pVm->iCol < 1 ){
		/* Don't bother hashing */
		return 0;
	}
	nHash = SyBinHash((const void *)pName->zString,pName->nByte);
	/* Perform the lookup */
	pCol = pVm->apCol[nHash & ( pVm->iColSize - 1)];
	for(;;){
		if( pCol == 0 ){
			break;
		}
		if( nHash == pCol->nHash && SyStringCmp(pName,&pCol->sName,SyMemcmp) == 0 ){
			/* Collection found */
			return pCol;
		}
		/* Point to the next entry */
		pCol = pCol->pNextCol;
	}
	/* No such collection */
	return 0;
}